

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::~SocketWriter(SocketWriter *this)

{
  AbstractSocketWriter *in_RDI;
  
  in_RDI->_vptr_AbstractSocketWriter = (_func_int **)&PTR__SocketWriter_0095a928;
  if (*(int *)&in_RDI[1]._vptr_AbstractSocketWriter != -1) {
    (*in_RDI->_vptr_AbstractSocketWriter[3])();
  }
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  AbstractSocketWriter::~AbstractSocketWriter(in_RDI);
  return;
}

Assistant:

~SocketWriter() override {
      if (sockfd_ != -1)
        CloseConnection();
    }